

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding-hash.cc
# Opt level: O0

Index __thiscall wabt::BindingHash::FindIndex(BindingHash *this,Var *var)

{
  bool bVar1;
  string *name;
  char *pcVar2;
  int __c;
  Var *__s;
  Var *var_local;
  BindingHash *this_local;
  
  __s = var;
  bVar1 = Var::is_name(var);
  if (bVar1) {
    name = Var::name_abi_cxx11_(var);
    this_local._4_4_ = FindIndex(this,name);
  }
  else {
    pcVar2 = Var::index(var,(char *)__s,__c);
    this_local._4_4_ = (Index)pcVar2;
  }
  return this_local._4_4_;
}

Assistant:

Index BindingHash::FindIndex(const Var& var) const {
  if (var.is_name()) {
    return FindIndex(var.name());
  }
  return var.index();
}